

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

int lyv_list_equal(void *val1_p,void *val2_p,int UNUSED_mod,void *UNUSED_cb_data)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *elem;
  undefined8 *puVar4;
  ly_ctx *ctx;
  long *plVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  if ((val1_p == (void *)0x0) || (val2_p == (void *)0x0)) {
    __assert_fail("val1_p && val2_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17a,"int lyv_list_equal(void *, void *, int, void *)");
  }
  plVar2 = *val1_p;
  if (plVar2 == (long *)0x0) {
LAB_001203fc:
    __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17f,"int lyv_list_equal(void *, void *, int, void *)");
  }
  puVar3 = (undefined8 *)*plVar2;
  uVar1 = *(uint *)(puVar3 + 7);
  if ((uVar1 & 0x18) == 0) goto LAB_001203fc;
  elem = *val2_p;
  if ((elem == (long *)0x0) || (puVar4 = (undefined8 *)*elem, puVar4 != puVar3)) {
    __assert_fail("second && (second->schema == first->schema)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x180,"int lyv_list_equal(void *, void *, int, void *)");
  }
  ctx = *(ly_ctx **)puVar3[6];
  if (uVar1 == 0x10) {
    if ((ulong)*(byte *)((long)puVar3 + 0x1e) != 0) {
      uVar9 = 0;
LAB_00120368:
      lVar10 = *(long *)(puVar3[0x11] + uVar9 * 8);
      for (plVar5 = (long *)plVar2[8]; plVar6 = (long *)elem[8], plVar5 != (long *)0x0;
          plVar5 = (long *)plVar5[3]) {
        if (*plVar5 == lVar10) {
          lVar8 = plVar5[7];
          goto joined_r0x0012038d;
        }
      }
      lVar8 = 0;
joined_r0x0012038d:
      do {
        if (plVar6 == (long *)0x0) goto LAB_001203a0;
        if (*plVar6 == lVar10) {
          lVar10 = plVar6[7];
          goto LAB_001203a9;
        }
        plVar6 = (long *)plVar6[3];
      } while( true );
    }
LAB_001203cc:
    iVar7 = 0;
  }
  else {
    if (uVar1 == 8) {
      if ((((*(byte *)(puVar3 + 3) & 2) != 0) &&
          ((*(byte *)((undefined8 *)puVar3[6] + 8) & 0xc) != 0)) || (plVar2[7] != elem[7]))
      goto LAB_001203cc;
      ly_vlog(ctx,LYE_DUPLEAFLIST,LY_VLOG_LYD,elem,*puVar4);
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
             ,0x1b3);
    }
LAB_001203f2:
    iVar7 = 1;
  }
  return iVar7;
LAB_001203a0:
  lVar10 = 0;
LAB_001203a9:
  if (lVar8 != lVar10) goto LAB_001203cc;
  uVar9 = uVar9 + 1;
  if (uVar9 == *(byte *)((long)puVar3 + 0x1e)) goto code_r0x001203b6;
  goto LAB_00120368;
code_r0x001203b6:
  ly_vlog(ctx,LYE_DUPLIST,LY_VLOG_LYD,elem,*puVar4);
  goto LAB_001203f2;
}

Assistant:

static int
lyv_list_equal(void *val1_p, void *val2_p, int UNUSED(mod), void *UNUSED(cb_data))
{
    struct ly_ctx *ctx;
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter, *first, *second;
    const char *val1, *val2;
    int i;

    assert(val1_p && val2_p);

    first = *((struct lyd_node **)val1_p);
    second = *((struct lyd_node **)val2_p);

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema == first->schema));

    ctx = first->schema->module->ctx;

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= LYS_VERSION_1_1) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)) {
            LOGVAL(ctx, LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                   ((struct lyd_node_leaf_list *)second)->value_str);
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        LOGVAL(ctx, LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        return 1;

    default:
        LOGINT(ctx);
        return 1;
    }
}